

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O0

unsigned_long Imf_2_5::uiAdd<unsigned_long>(unsigned_long a,unsigned_long b)

{
  unsigned_long uVar1;
  OverflowExc *this;
  long in_RSI;
  ulong in_RDI;
  StaticAssertionFailed<true> staticAssertionFailed;
  
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (uVar1 - in_RSI < in_RDI) {
    this = (OverflowExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::OverflowExc::OverflowExc(this,"Integer addition overflow.");
    __cxa_throw(this,&Iex_2_5::OverflowExc::typeinfo,Iex_2_5::OverflowExc::~OverflowExc);
  }
  return in_RDI + in_RSI;
}

Assistant:

T
uiAdd (T a, T b)
{
    //
    // Unsigned integer addition
    //

    IMF_STATIC_ASSERT (!std::numeric_limits<T>::is_signed &&
                        std::numeric_limits<T>::is_integer);

    if (a > std::numeric_limits<T>::max() - b)
        throw IEX_NAMESPACE::OverflowExc ("Integer addition overflow.");

    return a + b;
}